

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidSchema.hh
# Opt level: O0

void __thiscall avro::ValidSchema::~ValidSchema(ValidSchema *this)

{
  boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x23728e);
  return;
}

Assistant:

class AVRO_DECL ValidSchema {
public:
    explicit ValidSchema(const NodePtr &root);
    explicit ValidSchema(const Schema &schema);
    ValidSchema();

    void setSchema(const Schema &schema);

    const NodePtr &root() const {
        return root_;
    }

    void toJson(std::ostream &os) const;

    void toFlatList(std::ostream &os) const;

  protected:
    NodePtr root_;
}